

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool ReadV1_TCODE_ANNOTATION_Helper(ON_BinaryArchive *archive,char *buffer,ON_wString *tc)

{
  bool bVar1;
  uint in_EAX;
  char *s;
  size_t sVar2;
  size_t count;
  int j;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  bVar1 = ON_BinaryArchive::ReadInt32(archive,1,(ON__INT32 *)((long)&uStack_38 + 4));
  if (bVar1) {
    sVar2 = (long)uStack_38._4_4_ + 1;
    s = buffer;
    if ((buffer != (char *)0x0 && (long)uStack_38._4_4_ < 0x80) ||
       (s = (char *)onmalloc(sVar2), s != (char *)0x0)) {
      memset(s,0,sVar2);
      count = (size_t)uStack_38._4_4_;
      sVar2 = ON_BinaryArchive::Read(archive,count,s);
      if (sVar2 == count) {
        s[uStack_38._4_4_] = '\0';
        ON_wString::operator=(tc,s);
        if (s == buffer) {
          return true;
        }
      }
      else if (s == buffer) {
        return false;
      }
      onfree(s);
      return sVar2 == count;
    }
  }
  return false;
}

Assistant:

static bool ReadV1_TCODE_ANNOTATION_Helper( ON_BinaryArchive& archive, char* buffer, ON_wString& tc )
{
  char* cp = 0;
  int j = 0;
  if( !archive.ReadInt( &j))
    return false;
  size_t sz = (j+1)*sizeof(cp[0]);
  if( j > BUFLEN - 1 || !buffer )
  {
    cp = (char*)onmalloc( sz );
    if( !cp)
      return false;
  }
  else
  {
    cp = buffer;
  }

  memset( cp, 0, sz );
  if( !archive.ReadChar( j,  cp))
  {
    if ( cp != buffer )
      onfree(cp);
    return false;
  }

  cp[j] = 0;
  tc = cp;
  if ( cp != buffer )
    onfree( cp );
  return true;
}